

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

FillDynamicLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_filldynamic(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x442) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x442;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    FillDynamicLayerParams::FillDynamicLayerParams(this_00.filldynamic_);
    (this->layer_).filldynamic_ = (FillDynamicLayerParams *)this_00;
  }
  return (FillDynamicLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::FillDynamicLayerParams* NeuralNetworkLayer::mutable_filldynamic() {
  if (!has_filldynamic()) {
    clear_layer();
    set_has_filldynamic();
    layer_.filldynamic_ = new ::CoreML::Specification::FillDynamicLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.fillDynamic)
  return layer_.filldynamic_;
}